

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdirlisting.cpp
# Opt level: O2

void __thiscall
QDirListingPrivate::checkAndPushDirectory(QDirListingPrivate *this,QDirEntryInfo *entryInfo)

{
  QStringView fileName;
  bool bVar1;
  Filters *pFVar2;
  uint uVar3;
  long in_FS_OFFSET;
  qsizetype in_stack_ffffffffffffffd0;
  storage_type_conflict *psVar4;
  
  psVar4 = *(storage_type_conflict **)(in_FS_OFFSET + 0x28);
  uVar3 = (this->iteratorFlags).super_QFlagsStorageHelper<QDirListing::IteratorFlag,_4>.
          super_QFlagsStorage<QDirListing::IteratorFlag>.i;
  if (((uVar3 >> 10 & 1) != 0) &&
     (((uVar3 >> 0xb & 1) != 0 || (bVar1 = QDirEntryInfo::isSymLink(entryInfo), !bVar1)))) {
    QDirEntryInfo::fileName((QString *)&stack0xffffffffffffffc0,entryInfo);
    fileName.m_data = psVar4;
    fileName.m_size = in_stack_ffffffffffffffd0;
    bVar1 = isDotOrDotDot(fileName);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)&stack0xffffffffffffffc0);
    if (!bVar1) {
      uVar3 = 0x40;
      pFVar2 = (Filters *)&this->iteratorFlags;
      if (this->useLegacyFilters != false) {
        uVar3 = 0x500;
        pFVar2 = &this->legacyDirFilters;
      }
      if ((((((QFlagsStorage<QDirListing::IteratorFlag> *)
             &(pFVar2->super_QFlagsStorageHelper<QDir::Filter,_4>).super_QFlagsStorage<QDir::Filter>
             )->i & uVar3) != 0) || (bVar1 = QDirEntryInfo::isHidden(entryInfo), !bVar1)) &&
         (bVar1 = QDirEntryInfo::isDir(entryInfo), bVar1)) {
        pushDirectory(this,entryInfo);
      }
    }
  }
  if (*(storage_type_conflict **)(in_FS_OFFSET + 0x28) != psVar4) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDirListingPrivate::checkAndPushDirectory(QDirEntryInfo &entryInfo)
{
    using F = QDirListing::IteratorFlag;
    // If we're doing flat iteration, we're done.
    if (!iteratorFlags.testAnyFlags(F::Recursive))
        return;

    // Follow symlinks only when asked
    if (!iteratorFlags.testAnyFlags(F::FollowDirSymlinks) && entryInfo.isSymLink())
        return;

    // Never follow . and ..
    if (isDotOrDotDot(entryInfo.fileName()))
        return;

    // No hidden directories unless requested
    const bool includeHidden = [this]() {
        if (useLegacyFilters)
            return legacyDirFilters.testAnyFlags(QDir::AllDirs | QDir::Hidden);
        return iteratorFlags.testAnyFlags(QDirListing::IteratorFlag::IncludeHidden);
    }();
    if (!includeHidden && entryInfo.isHidden())
        return;

    // Never follow non-directory entries
    if (!entryInfo.isDir())
        return;

    pushDirectory(entryInfo);
}